

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

vec<Minisat::Solver::Watcher,_int> * __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::lookup(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
         *this,Lit *idx)

{
  int iVar1;
  char *__function;
  
  iVar1 = idx->x;
  if (iVar1 < (this->dirty).map.sz) {
    if ((this->dirty).map.data[iVar1] != '\0') {
      clean(this,idx);
      iVar1 = idx->x;
    }
    if (iVar1 < (this->occs).map.sz) {
      return (this->occs).map.data + iVar1;
    }
    __function = 
    "V &Minisat::IntMap<Minisat::Lit, Minisat::vec<Minisat::Solver::Watcher>, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = Minisat::vec<Minisat::Solver::Watcher>, MkIndex = Minisat::MkIndexLit]"
    ;
  }
  else {
    __function = 
    "V &Minisat::IntMap<Minisat::Lit, char, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = char, MkIndex = Minisat::MkIndexLit]"
    ;
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,__function);
}

Assistant:

Vec&  lookup    (const K& idx){ if (dirty[idx]) clean(idx); return occs[idx]; }